

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadT<unsigned_int>
          (BinaryReader *this,uint *out_value,char *type_name,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  
  OVar2 = (this->state_).offset;
  if (this->read_end_ < OVar2 + 4) {
    PrintError(this,"unable to read %s: %s");
    return (Result)Error;
  }
  *out_value = *(uint *)((this->state_).data + OVar2);
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 4;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadT(T* out_value,
                           const char* type_name,
                           const char* desc) {
  if (state_.offset + sizeof(T) > read_end_) {
    PrintError("unable to read %s: %s", type_name, desc);
    return Result::Error;
  }
  memcpy(out_value, state_.data + state_.offset, sizeof(T));
  state_.offset += sizeof(T);
  return Result::Ok;
}